

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpatialMotionVector.cpp
# Opt level: O0

SpatialMotionVector * __thiscall
iDynTree::SpatialMotionVector::cross(SpatialMotionVector *this,SpatialMotionVector *other)

{
  LinearVector3T *pLVar1;
  AngularVector3T *pAVar2;
  SpatialVector<iDynTree::SpatialMotionVector> *in_RDX;
  GeomVector3 *in_RSI;
  SpatialVector<iDynTree::SpatialMotionVector> *in_RDI;
  SpatialMotionVector *res;
  GeomVector3 *in_stack_ffffffffffffff58;
  GeomVector3 *this_00;
  double local_78;
  double local_70;
  double local_68;
  double local_30;
  double local_28;
  double local_20;
  GeomVector3 *this_01;
  
  this_01 = in_RSI;
  SpatialMotionVector((SpatialMotionVector *)0x6f0cae);
  this_00 = in_RSI + 1;
  SpatialVector<iDynTree::SpatialMotionVector>::getLinearVec3(in_RDX);
  GeomVector3::cross(this_01,&in_RDX->linearVec3);
  SpatialVector<iDynTree::SpatialMotionVector>::getAngularVec3(in_RDX);
  GeomVector3::cross(this_01,&in_RDX->linearVec3);
  GeomVector3::operator+(this_00,in_stack_ffffffffffffff58);
  pLVar1 = SpatialVector<iDynTree::SpatialMotionVector>::getLinearVec3(in_RDI);
  (pLVar1->super_Vector3).m_data[0] = local_30;
  (pLVar1->super_Vector3).m_data[1] = local_28;
  (pLVar1->super_Vector3).m_data[2] = local_20;
  SpatialVector<iDynTree::SpatialMotionVector>::getAngularVec3(in_RDX);
  GeomVector3::cross(this_01,&in_RDX->linearVec3);
  pAVar2 = SpatialVector<iDynTree::SpatialMotionVector>::getAngularVec3(in_RDI);
  (pAVar2->super_Vector3).m_data[0] = local_78;
  (pAVar2->super_Vector3).m_data[1] = local_70;
  (pAVar2->super_Vector3).m_data[2] = local_68;
  return (SpatialMotionVector *)in_RDI;
}

Assistant:

SpatialMotionVector SpatialMotionVector::cross(const SpatialMotionVector& other) const
{
    SpatialMotionVector res;

    res.getLinearVec3()  = this->angularVec3.cross(other.getLinearVec3()) + this->linearVec3.cross(other.getAngularVec3());
    res.getAngularVec3() =                                                  this->angularVec3.cross(other.getAngularVec3());

    return res;
}